

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GenerateOutput
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,OutputDirective *output_directive,GeneratorContext *generator_context)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  short *psVar3;
  ulong uVar4;
  pointer pcVar5;
  bool bVar6;
  int iVar7;
  mapped_type *pmVar8;
  undefined4 extraout_var;
  LogMessage *pLVar9;
  ostream *poVar10;
  CommandLineInterface *this_00;
  string parameters_1;
  string parameters;
  string error;
  string local_b0;
  LogMessage local_90;
  string local_58;
  pointer local_38;
  
  paVar1 = &local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)paVar1;
  if (output_directive->generator == (CodeGenerator *)0x0) {
    psVar3 = (short *)(output_directive->name)._M_dataplus._M_p;
    uVar4 = (output_directive->name)._M_string_length;
    if ((long)uVar4 < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig(uVar4,"string length exceeds max size");
LAB_0023052a:
      if (*psVar3 != 0x2d2d) goto LAB_00230564;
      local_38 = (output_directive->name)._M_dataplus._M_p;
      uVar4 = (output_directive->name)._M_string_length;
      if ((long)uVar4 < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig
                  (uVar4,"string length exceeds max size");
      }
      else if (uVar4 < 4) goto LAB_00230564;
      if (*(int *)(local_38 + (uVar4 - 4)) != 0x74756f5f) goto LAB_00230564;
    }
    else {
      if (1 < uVar4) goto LAB_0023052a;
LAB_00230564:
      internal::LogMessage::LogMessage
                (&local_90,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                 ,0x85e);
      pLVar9 = internal::LogMessage::operator<<
                         (&local_90,
                          "CHECK failed: HasPrefixString(output_directive.name, \"--\") && HasSuffixString(output_directive.name, \"_out\"): "
                         );
      pLVar9 = internal::LogMessage::operator<<(pLVar9,"Bad name for plugin generator: ");
      pLVar9 = internal::LogMessage::operator<<(pLVar9,&output_directive->name);
      internal::LogFinisher::operator=((LogFinisher *)&local_b0,pLVar9);
      internal::LogMessage::~LogMessage(&local_90);
    }
    anon_unknown_4::PluginName
              ((string *)&local_90,(anon_unknown_4 *)(this->plugin_prefix_)._M_dataplus._M_p,
               (string *)(this->plugin_prefix_)._M_string_length,&output_directive->name);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    pcVar2 = (output_directive->parameter)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + (output_directive->parameter)._M_string_length);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->plugin_parameters_,(key_type *)&local_90);
    if (pmVar8->_M_string_length != 0) {
      if (local_b0._M_string_length != 0) {
        std::__cxx11::string::append((char *)&local_b0);
      }
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->plugin_parameters_,(key_type *)&local_90);
      std::__cxx11::string::_M_append((char *)&local_b0,(ulong)(pmVar8->_M_dataplus)._M_p);
    }
    bVar6 = GeneratePluginOutput
                      (this,parsed_files,(string *)&local_90,&local_b0,generator_context,&local_58);
    if (bVar6) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((pointer)local_90._0_8_ != (pointer)((long)&local_90 + 0x10U)) {
LAB_00230692:
        operator_delete((void *)local_90._0_8_);
      }
LAB_00230697:
      bVar6 = true;
      goto LAB_0023079f;
    }
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(output_directive->name)._M_dataplus._M_p,
                         (output_directive->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,": ",2);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_58._M_dataplus._M_p,local_58._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((pointer)local_90._0_8_ != (pointer)((long)&local_90 + 0x10U)) goto LAB_00230798;
  }
  else {
    pcVar5 = (pointer)((long)&local_90 + 0x10);
    pcVar2 = (output_directive->parameter)._M_dataplus._M_p;
    local_90._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + (output_directive->parameter)._M_string_length);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->generator_parameters_,&output_directive->name);
    if (pmVar8->_M_string_length != 0) {
      if (local_90.filename_ != (char *)0x0) {
        std::__cxx11::string::append((char *)&local_90);
      }
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->generator_parameters_,&output_directive->name);
      std::__cxx11::string::_M_append((char *)&local_90,(ulong)(pmVar8->_M_dataplus)._M_p);
    }
    this_00 = (CommandLineInterface *)output_directive->generator;
    iVar7 = (**(_func_int **)((long)(this_00->executable_name_)._M_dataplus._M_p + 0x20))();
    bVar6 = EnforceProto3OptionalSupport
                      (this_00,&output_directive->name,CONCAT44(extraout_var,iVar7),parsed_files);
    if (bVar6) {
      iVar7 = (*output_directive->generator->_vptr_CodeGenerator[3])
                        (output_directive->generator,parsed_files,&local_90,generator_context,
                         &local_58);
      if ((char)iVar7 != '\0') {
        if ((pointer)local_90._0_8_ != pcVar5) goto LAB_00230692;
        goto LAB_00230697;
      }
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(output_directive->name)._M_dataplus._M_p,
                           (output_directive->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,": ",2);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_58._M_dataplus._M_p,local_58._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
    }
    if ((pointer)local_90._0_8_ != pcVar5) {
LAB_00230798:
      operator_delete((void *)local_90._0_8_);
    }
  }
  bVar6 = false;
LAB_0023079f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return bVar6;
}

Assistant:

bool CommandLineInterface::GenerateOutput(
    const std::vector<const FileDescriptor*>& parsed_files,
    const OutputDirective& output_directive,
    GeneratorContext* generator_context) {
  // Call the generator.
  std::string error;
  if (output_directive.generator == NULL) {
    // This is a plugin.
    GOOGLE_CHECK(HasPrefixString(output_directive.name, "--") &&
          HasSuffixString(output_directive.name, "_out"))
        << "Bad name for plugin generator: " << output_directive.name;

    std::string plugin_name = PluginName(plugin_prefix_, output_directive.name);
    std::string parameters = output_directive.parameter;
    if (!plugin_parameters_[plugin_name].empty()) {
      if (!parameters.empty()) {
        parameters.append(",");
      }
      parameters.append(plugin_parameters_[plugin_name]);
    }
    if (!GeneratePluginOutput(parsed_files, plugin_name, parameters,
                              generator_context, &error)) {
      std::cerr << output_directive.name << ": " << error << std::endl;
      return false;
    }
  } else {
    // Regular generator.
    std::string parameters = output_directive.parameter;
    if (!generator_parameters_[output_directive.name].empty()) {
      if (!parameters.empty()) {
        parameters.append(",");
      }
      parameters.append(generator_parameters_[output_directive.name]);
    }
    if (!EnforceProto3OptionalSupport(
            output_directive.name,
            output_directive.generator->GetSupportedFeatures(), parsed_files)) {
      return false;
    }

    if (!output_directive.generator->GenerateAll(parsed_files, parameters,
                                                 generator_context, &error)) {
      // Generator returned an error.
      std::cerr << output_directive.name << ": " << error << std::endl;
      return false;
    }
  }

  return true;
}